

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int iVar1;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar2;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar3;
  type piVar4;
  type pdVar5;
  type prVar6;
  unique_ptr<int[],_std::default_delete<int[]>_> *this_00;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double a;
  type *last;
  type *first;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_38;
  double sum_a_pi_p;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Stack_28;
  int r_size;
  bit_array *x_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  *this_local;
  
  sum_a_pi_p._4_4_ = 0;
  _Stack_28._M_head_impl = (row_value *)x;
  x_local = (bit_array *)end;
  begin_local = (row_iterator)this;
  for (end_local = begin; end_local != (row_iterator)x_local; end_local = end_local + 1) {
    local_38._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)
         (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)0x0;
    sparse_matrix<int>::column((sparse_matrix<int> *)&first,(int)this + 0x10);
    ppcVar2 = std::
              get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                          *)&first);
    ppcVar3 = std::
              get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                          *)&first);
    while (iVar1 = sum_a_pi_p._4_4_, *ppcVar2 != *ppcVar3) {
      this_00 = &this->A;
      piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         (this_00,(long)(*ppcVar2)->value);
      dVar7 = (double)*piVar4;
      std::abs((int)this_00);
      pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->pi,(long)(*ppcVar2)->row);
      dVar8 = *pdVar5;
      pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->P,(long)(*ppcVar2)->value);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar7;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           local_38._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar8 + *pdVar5;
      auVar9 = vfmadd213sd_fma(auVar9,auVar10,auVar11);
      local_38._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl = auVar9._0_8_;
      *ppcVar2 = *ppcVar2 + 1;
    }
    prVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)sum_a_pi_p._4_4_);
    prVar6->id = iVar1;
    piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->A,(long)end_local->value);
    iVar1 = *piVar4;
    prVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)sum_a_pi_p._4_4_);
    prVar6->f = iVar1;
    dVar8 = quadratic_cost_type<double>::operator()
                      (this->c,end_local->column,(bit_array *)_Stack_28._M_head_impl);
    dVar8 = dVar8 - (double)local_38._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                            .super__Head_base<0UL,_int_*,_false>._M_head_impl;
    prVar6 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)sum_a_pi_p._4_4_);
    prVar6->value = dVar8;
    sum_a_pi_p._4_4_ = sum_a_pi_p._4_4_ + 1;
  }
  return sum_a_pi_p._4_4_;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        // to_log(
        //  debug_os, "  compute-reduced-cost {}\n", std::distance(begin,
        //  end));

        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi_p = 0;

            for (auto [first, last] = ap.column(begin->column); first != last;
                 ++first) {
                auto a = std::abs(static_cast<Float>(A[first->value]));
                sum_a_pi_p += a * (pi[first->row] + P[first->value]);
            }

            R[r_size].id = r_size;
            R[r_size].f = A[begin->value];
            R[r_size].value = c(begin->column, x) - sum_a_pi_p;

            // to_log(debug_os,
            //       4u,
            //       "Compute: {} = {} - {} - {}\n",
            //       r_size,
            //       c(begin->column, x),
            //       sum_pi,
            //       sum_p);

            // to_log(debug_os, 4u, "{}x{}\n", R[r_size].f, R[r_size].value);

            ++r_size;
        }

        // to_log(debug_os, "\n");

        return r_size;
    }